

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

string * Eof(string *__return_storage_ptr__,string *FileName)

{
  int_type iVar1;
  istream local_228 [8];
  ifstream ResultReader;
  string *FileName_local;
  string *Results;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(local_228,(string *)FileName,_S_in);
  iVar1 = std::char_traits<char>::eof();
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (local_228,(string *)__return_storage_ptr__,(char)iVar1);
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string Eof(std::string FileName)
{
    std::string Results;
    std::ifstream ResultReader(FileName);
    std::getline(ResultReader, Results, (char)std::char_traits<char>::eof());
    return Results;
}